

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * __thiscall llvm::raw_ostream::write_uuid(raw_ostream *this,uint8_t *UUID)

{
  format_object<unsigned_char> local_38;
  int local_1c;
  uint8_t *puStack_18;
  int Idx;
  uint8_t *UUID_local;
  raw_ostream *this_local;
  
  puStack_18 = UUID;
  UUID_local = (uint8_t *)this;
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    format<unsigned_char>(&local_38,"%02X",puStack_18 + local_1c);
    operator<<(this,&local_38.super_format_object_base);
    if ((((local_1c == 3) || (local_1c == 5)) || (local_1c == 7)) || (local_1c == 9)) {
      operator<<(this,"-");
    }
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::write_uuid(const uuid_t UUID) {
  for (int Idx = 0; Idx < 16; ++Idx) {
    *this << format("%02" PRIX32, UUID[Idx]);
    if (Idx == 3 || Idx == 5 || Idx == 7 || Idx == 9)
      *this << "-";
  }
  return *this;
}